

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_at_most_n.hpp
# Opt level: O0

tuple<std::_Fwd_list_const_iterator<unsigned_int>,_long,_unsigned_int_*> * __thiscall
burst::detail::copy_at_most_n_impl<std::_Fwd_list_const_iterator<unsigned_int>,long,unsigned_int*>
          (tuple<std::_Fwd_list_const_iterator<unsigned_int>,_long,_unsigned_int_*>
           *__return_storage_ptr__,detail *this,_Fwd_list_node_base *first,uint *last,long n)

{
  bool bVar1;
  reference puVar2;
  long local_48;
  uint *local_40;
  long m;
  uint *result_local;
  long n_local;
  _Self local_20;
  _Fwd_list_const_iterator<unsigned_int> last_local;
  _Fwd_list_const_iterator<unsigned_int> first_local;
  
  local_40 = last;
  m = n;
  result_local = last;
  local_20._M_node = first;
  last_local._M_node = (_Fwd_list_node_base *)this;
  while (bVar1 = std::operator!=(&last_local,&local_20), bVar1 && 0 < (long)local_40) {
    puVar2 = std::_Fwd_list_const_iterator<unsigned_int>::operator*(&last_local);
    *(uint *)m = *puVar2;
    std::_Fwd_list_const_iterator<unsigned_int>::operator++(&last_local);
    m = m + 4;
    local_40 = (uint *)((long)local_40 + -1);
  }
  local_48 = (long)result_local - (long)local_40;
  std::make_tuple<std::_Fwd_list_const_iterator<unsigned_int>&,long,unsigned_int*&>
            (__return_storage_ptr__,&last_local,&local_48,(uint **)&m);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<InputIterator, Integral, OutputIterator>
            copy_at_most_n_impl
            (
                InputIterator first,
                InputIterator last,
                Integral n,
                OutputIterator result,
                std::input_iterator_tag
            )
        {
            auto m = n;
            while (first != last && m > 0)
            {
                *result = *first;

                ++first;
                ++result;
                --m;
            }

            return std::make_tuple(first, n - m, result);
        }